

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

string * __thiscall
testing::internal::String::ShowWideCString_abi_cxx11_
          (string *__return_storage_ptr__,String *this,wchar_t *wide_c_str)

{
  int in_ECX;
  
  if (this == (String *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"(null)","");
  }
  else {
    WideStringToUtf8_abi_cxx11_
              (__return_storage_ptr__,(internal *)this,(wchar_t *)0xffffffff,in_ECX);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string String::ShowWideCString(const wchar_t * wide_c_str) {
  if (wide_c_str == NULL)  return "(null)";

  return internal::WideStringToUtf8(wide_c_str, -1);
}